

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::create_path(dynamic_string *fullpath)

{
  char c;
  ushort uVar1;
  char *pcVar2;
  uint16 uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  dynamic_string cur_path;
  dynamic_string local_40;
  
  local_40.m_buf_size = 0;
  local_40.m_len = 0;
  local_40.m_pStr = (char *)0x0;
  uVar1 = fullpath->m_len;
  uVar5 = (ulong)(uVar1 - 1);
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = fullpath->m_pStr;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    if (local_40.m_len == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = local_40.m_pStr[local_40.m_len - 1] != '/';
    }
    c = pcVar2[uVar4];
    if (((bool)(c == '/' & bVar6)) || (uVar5 == uVar4)) {
      uVar3 = local_40.m_len;
      if ((c != '/') && (uVar5 == uVar4)) {
        dynamic_string::append_char(&local_40,c);
        uVar3 = local_40.m_len;
      }
      bVar6 = dynamic_string::operator==(&local_40,"/");
      if ((!bVar6 && uVar3 != 0) && (local_40.m_len != 0)) {
        pcVar2 = local_40.m_pStr;
        if (local_40.m_pStr == (char *)0x0) {
          pcVar2 = "";
        }
        mkdir(pcVar2,0x1ff);
      }
    }
    dynamic_string::append_char(&local_40,c);
  }
  dynamic_string::~dynamic_string(&local_40);
  return true;
}

Assistant:

bool file_utils::create_path(const dynamic_string& fullpath)
    {
#ifdef WIN32
        bool got_unc = false;
#endif
        dynamic_string cur_path;

        const int l = fullpath.get_len();

        int n = 0;
        while (n < l)
        {
            const char c = fullpath.get_ptr()[n];

            const bool sep = is_path_separator(c);
            const bool back_sep = is_path_separator(cur_path.back());
            const bool is_last_char = (n == (l - 1));

            if (((sep) && (!back_sep)) || (is_last_char))
            {
                if ((is_last_char) && (!sep))
                {
                    cur_path.append_char(c);
                }

                bool valid = !cur_path.is_empty();

#ifdef WIN32
                // reject obvious stuff (drives, beginning of UNC paths):
                // c:\b\cool
                // \\machine\blah
                // \cool\blah
                if ((cur_path.get_len() == 2) && (cur_path[1] == ':'))
                {
                    valid = false;
                }

                else if ((cur_path.get_len() >= 2) && (cur_path[0] == '\\') && (cur_path[1] == '\\'))
                {
                    if (!got_unc)
                    {
                        valid = false;
                    }
                    got_unc = true;
                }
                else if (cur_path == "\\")
                {
                    valid = false;
                }
#endif
                if (cur_path == "/")
                {
                    valid = false;
                }

                if ((valid) && (cur_path.get_len()))
                {
#ifdef WIN32
                    _mkdir(cur_path.get_ptr());
#else
                    mkdir(cur_path.get_ptr(), S_IRWXU | S_IRWXG | S_IRWXO);
#endif
                }
            }

            cur_path.append_char(c);

            n++;
        }

        return true;
    }